

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enigma.h
# Opt level: O1

bool ClownLZSS::EnigmaCompress<std::ofstream&>
               (uchar *data,size_t data_size,basic_ofstream<char,_std::char_traits<char>_> *output)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> output_wrapped;
  CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> local_28;
  
  local_28.
  super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  .output = (OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             )(OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
               )output;
  iVar2 = std::ostream::tellp();
  bVar1 = Internal::Enigma::Compress<std::ofstream>(data,data_size,&local_28);
  iVar3 = std::ostream::tellp();
  if ((iVar3 - iVar2 & 1U) != 0) {
    std::ostream::put((char)local_28.
                            super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                            .output);
  }
  return bVar1;
}

Assistant:

bool EnigmaCompress(const unsigned char* const data, const std::size_t data_size, T &&output)
	{
		using namespace Internal;

		CompressorOutput output_wrapped(std::forward<T>(output));

		const auto start = output_wrapped.Tell();
		const bool success = Enigma::Compress(data, data_size, output_wrapped);

		if (output_wrapped.Distance(start) % 2 != 0)
			output_wrapped.Write(0);

		return success;
	}